

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O3

void duckdb_zstd::HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  BYTE *pBVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  BYTE *pBVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  ulong *puVar24;
  ulong uVar25;
  BYTE *pBVar26;
  ulong local_e8;
  ulong local_e0;
  U64 local_d8;
  BYTE *local_d0;
  ulong *local_c8;
  BYTE *local_c0;
  ulong *local_b0;
  BYTE *local_a8 [10];
  BYTE *local_58 [5];
  
  pvVar6 = args->dt;
  pBVar7 = args->ilowest;
  local_e8 = args->bits[0];
  local_d8 = args->bits[1];
  local_e0 = args->bits[2];
  uVar22 = args->bits[3];
  local_b0 = (ulong *)args->ip[0];
  local_c8 = (ulong *)args->ip[1];
  puVar24 = (ulong *)args->ip[2];
  puVar21 = (ulong *)args->ip[3];
  local_a8[0] = args->op[0];
  local_d0 = args->op[1];
  local_a8[1] = local_d0;
  local_c0 = args->op[2];
  local_a8[3] = args->op[3];
  local_a8[2] = local_c0;
  local_58[2] = local_a8[3];
  local_58[3] = args->oend;
  local_58[0] = local_d0;
  local_58[1] = local_c0;
  while( true ) {
    lVar16 = 0;
    uVar14 = (ulong)((long)local_b0 - (long)pBVar7) / 7;
    do {
      uVar12 = (ulong)((long)local_58[lVar16] - (long)local_a8[lVar16]) / 10;
      if (uVar14 < uVar12) {
        uVar12 = uVar14;
      }
      lVar16 = lVar16 + 1;
      uVar14 = uVar12;
    } while (lVar16 != 4);
    if ((((uVar12 == 0) || (local_c8 < local_b0)) || (puVar24 < local_c8)) || (puVar21 < puVar24))
    break;
    pBVar13 = local_a8[3] + uVar12 * 5;
    pBVar26 = local_c0;
    do {
      uVar14 = local_e8 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar14 * 4 + 2);
      uVar15 = (ulong)*(byte *)((long)pvVar6 + uVar14 * 4 + 3);
      *(undefined2 *)local_a8[0] = *(undefined2 *)((long)pvVar6 + uVar14 * 4);
      uVar12 = local_d8 >> 0x35;
      uVar14 = local_e8 << ((ulong)bVar1 & 0x3f);
      bVar1 = *(byte *)((long)pvVar6 + uVar12 * 4 + 2);
      uVar25 = (ulong)*(byte *)((long)pvVar6 + uVar12 * 4 + 3);
      *(undefined2 *)local_d0 = *(undefined2 *)((long)pvVar6 + uVar12 * 4);
      uVar12 = local_e0 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar12 * 4 + 2);
      uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar12 * 4 + 3);
      uVar23 = uVar14 >> 0x35;
      *(undefined2 *)pBVar26 = *(undefined2 *)((long)pvVar6 + uVar12 * 4);
      bVar3 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar19 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[0] + uVar15) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar12 = local_d8 << ((ulong)bVar1 & 0x3f);
      local_e0 = local_e0 << ((ulong)bVar2 & 0x3f);
      uVar23 = uVar12 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar20 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_d0 + uVar25) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar23 = local_e0 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar11 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(pBVar26 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar14 = uVar14 << ((ulong)bVar3 & 0x3f);
      uVar12 = uVar12 << ((ulong)bVar1 & 0x3f);
      uVar23 = uVar14 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar18 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[0] + uVar19 + uVar15) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar23 = uVar12 >> 0x35;
      lVar16 = uVar19 + uVar15;
      bVar3 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar15 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_d0 + uVar20 + uVar25) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      lVar9 = uVar20 + uVar25;
      local_e0 = local_e0 << ((ulong)bVar2 & 0x3f);
      uVar14 = uVar14 << ((ulong)bVar1 & 0x3f);
      uVar23 = local_e0 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar19 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(pBVar26 + uVar11 + uVar17) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar23 = uVar14 >> 0x35;
      lVar10 = uVar11 + uVar17;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar20 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[0] + uVar18 + lVar16) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      lVar16 = uVar18 + lVar16;
      uVar12 = uVar12 << ((ulong)bVar3 & 0x3f);
      local_e0 = local_e0 << ((ulong)bVar1 & 0x3f);
      uVar23 = uVar12 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar17 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_d0 + uVar15 + lVar9) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar23 = local_e0 >> 0x35;
      lVar9 = uVar15 + lVar9;
      bVar3 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar11 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(pBVar26 + uVar19 + lVar10) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      lVar10 = uVar19 + lVar10;
      uVar14 = uVar14 << ((ulong)bVar2 & 0x3f);
      uVar12 = uVar12 << ((ulong)bVar1 & 0x3f);
      uVar23 = uVar14 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[0] + uVar20 + lVar16) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar23 = uVar12 >> 0x35;
      bVar4 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      bVar5 = *(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_d0 + uVar17 + lVar9) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      local_e0 = local_e0 << ((ulong)bVar3 & 0x3f);
      local_a8[0] = local_a8[0] + (ulong)bVar2 + uVar20 + lVar16;
      local_d0 = local_d0 + (ulong)bVar5 + uVar17 + lVar9;
      uVar12 = uVar12 << ((ulong)bVar4 & 0x3f);
      uVar23 = local_e0 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      local_c0 = pBVar26 + (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3) + uVar11 + lVar10;
      *(undefined2 *)(pBVar26 + uVar11 + lVar10) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      local_e0 = local_e0 << ((ulong)bVar2 & 0x3f);
      uVar23 = uVar22 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar11 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)local_a8[3] = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar22 = uVar22 << ((ulong)bVar2 & 0x3f);
      uVar23 = uVar22 >> 0x35;
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar15 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[3] + uVar11) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar22 = uVar22 << ((ulong)bVar2 & 0x3f);
      uVar8 = 0;
      for (uVar14 = uVar14 << ((ulong)bVar1 & 0x3f); (uVar14 & 1) == 0;
          uVar14 = uVar14 >> 1 | 0x8000000000000000) {
        uVar8 = uVar8 + 1;
      }
      lVar16 = uVar15 + uVar11;
      local_b0 = (ulong *)((long)local_b0 - (ulong)(uVar8 >> 3));
      local_e8 = (*local_b0 | 1) << ((byte)uVar8 & 7);
      uVar23 = uVar22 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      uVar14 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[3] + uVar15 + uVar11) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      uVar22 = uVar22 << ((ulong)bVar1 & 0x3f);
      uVar8 = 0;
      for (; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
        uVar8 = uVar8 + 1;
      }
      lVar9 = uVar14 + lVar16;
      local_c8 = (ulong *)((long)local_c8 - (ulong)(uVar8 >> 3));
      local_d8 = (*local_c8 | 1) << ((byte)uVar8 & 7);
      uVar23 = uVar22 >> 0x35;
      uVar12 = (ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      uVar22 = uVar22 << ((ulong)*(byte *)((long)pvVar6 + uVar23 * 4 + 2) & 0x3f);
      uVar8 = 0;
      for (; (local_e0 & 1) == 0; local_e0 = local_e0 >> 1 | 0x8000000000000000) {
        uVar8 = uVar8 + 1;
      }
      *(undefined2 *)(local_a8[3] + uVar14 + lVar16) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      puVar24 = (ulong *)((long)puVar24 - (ulong)(uVar8 >> 3));
      uVar14 = *puVar24;
      uVar23 = uVar22 >> 0x35;
      bVar1 = *(byte *)((long)pvVar6 + uVar23 * 4 + 2);
      bVar2 = *(byte *)((long)pvVar6 + uVar23 * 4 + 3);
      *(undefined2 *)(local_a8[3] + uVar12 + lVar9) = *(undefined2 *)((long)pvVar6 + uVar23 * 4);
      local_e0 = (uVar14 | 1) << ((byte)uVar8 & 7);
      uVar8 = 0;
      for (uVar22 = uVar22 << ((ulong)bVar1 & 0x3f); (uVar22 & 1) == 0;
          uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        uVar8 = uVar8 + 1;
      }
      local_a8[3] = local_a8[3] + (ulong)bVar2 + uVar12 + lVar9;
      puVar21 = (ulong *)((long)puVar21 - (ulong)(uVar8 >> 3));
      uVar22 = (*puVar21 | 1) << ((byte)uVar8 & 7);
      pBVar26 = local_c0;
    } while (local_a8[3] < pBVar13);
    local_a8[1] = local_d0;
    local_a8[2] = local_c0;
  }
  args->bits[0] = local_e8;
  args->bits[1] = local_d8;
  args->bits[2] = local_e0;
  args->bits[3] = uVar22;
  args->ip[0] = (BYTE *)local_b0;
  args->ip[1] = (BYTE *)local_c8;
  args->ip[2] = (BYTE *)puVar24;
  args->ip[3] = (BYTE *)puVar21;
  args->op[2] = local_c0;
  args->op[3] = local_a8[3];
  args->op[0] = local_a8[0];
  args->op[1] = local_d0;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X2_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    BYTE* oend[4];
    HUF_DEltX2 const* const dtable = (HUF_DEltX2 const*)args->dt;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local registers. */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    oend[0] = op[1];
    oend[1] = op[2];
    oend[2] = op[3];
    oend[3] = args->oend;

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= oend[stream]);
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each loop does 5 table lookups for each of the 4 streams.
             * Each table lookup consumes up to 11 bits of input, and produces
             * up to 2 bytes of output.
             */
            /* We can consume up to 7 bytes of input per iteration per stream.
             * We also know that each input pointer is >= ip[0]. So we can run
             * iters loops before running out of input.
             */
            size_t iters = (size_t)(ip[0] - ilowest) / 7;
            /* Each iteration can produce up to 10 bytes of output per stream.
             * Each output stream my advance at different rates. So take the
             * minimum number of safe iterations among all the output streams.
             */
            for (stream = 0; stream < 4; ++stream) {
                size_t const oiters = (size_t)(oend[stream] - op[stream]) / 10;
                iters = MIN(iters, oiters);
            }

            /* Each iteration produces at least 5 output symbols. So until
             * op[3] crosses olimit, we know we haven't executed iters
             * iterations yet. This saves us maintaining an iters counter,
             * at the expense of computing the remaining # of iterations
             * more frequently.
             */
            olimit = op[3] + (iters * 5);

            /* Exit the fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X2_DECODE_SYMBOL(_stream, _decode3)                      \
    do {                                                              \
        if ((_decode3) || (_stream) != 3) {                           \
            int const index = (int)(bits[(_stream)] >> 53);           \
            HUF_DEltX2 const entry = dtable[index];                   \
            MEM_write16(op[(_stream)], entry.sequence); \
            bits[(_stream)] <<= (entry.nbBits) & 0x3F;                \
            op[(_stream)] += (entry.length);                          \
        }                                                             \
    } while (0)

#define HUF_4X2_RELOAD_STREAM(_stream)                                  \
    do {                                                                \
        HUF_4X2_DECODE_SYMBOL(3, 1);                                    \
        {                                                               \
            int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
            int const nbBits = ctz & 7;                                 \
            int const nbBytes = ctz >> 3;                               \
            ip[(_stream)] -= nbBytes;                                   \
            bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
            bits[(_stream)] <<= nbBits;                                 \
        }                                                               \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols from each of the first 3 streams.
             * The final stream will be decoded during the reload phase
             * to reduce register pressure.
             */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X2_DECODE_SYMBOL, 0);

            /* Decode one symbol from the final stream */
            HUF_4X2_DECODE_SYMBOL(3, 1);

            /* Decode 4 symbols from the final stream & reload bitstreams.
             * The final stream is reloaded last, meaning that all 5 symbols
             * are decoded from the final stream before it is reloaded.
             */
            HUF_4X_FOR_EACH_STREAM(HUF_4X2_RELOAD_STREAM);
        } while (op[3] < olimit);
    }

#undef HUF_4X2_DECODE_SYMBOL
#undef HUF_4X2_RELOAD_STREAM

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}